

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

void __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
async_connect(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *this,
             string *host,string *service,function<void_(const_std::error_code_&)> *cb)

{
  basic_resolver_query<asio::ip::tcp> *this_00;
  undefined8 in_RCX;
  flags resolve_flags;
  string *in_RDX;
  string *in_RSI;
  protocol_type *in_RDI;
  results_type endpoint_iterator;
  query query;
  basic_resolver_entry<asio::ip::tcp> *in_stack_fffffffffffffee8;
  basic_resolver_query<asio::ip::tcp> *this_01;
  endpoint_type *in_stack_ffffffffffffff28;
  query *in_stack_ffffffffffffff30;
  basic_resolver<asio::ip::tcp,_asio::any_io_executor> *in_stack_ffffffffffffff38;
  basic_resolver_query<asio::ip::tcp> local_90;
  
  resolve_flags = (flags)((ulong)in_RCX >> 0x20);
  ::asio::ip::tcp::v4();
  this_01 = &local_90;
  ::asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (this_01,in_RDI,in_RDX,in_RSI,resolve_flags);
  ::asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  ::asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::lowest_layer
            ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)(in_RDI + 8));
  this_00 = (basic_resolver_query<asio::ip::tcp> *)
            ::asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator*
                      ((basic_resolver_iterator<asio::ip::tcp> *)0x7d3e62);
  ::asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint(in_stack_fffffffffffffee8);
  ::asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::
  async_connect<std::function<void_(const_std::error_code_&)>_&>
            ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28,(function<void_(const_std::error_code_&)> *)this_01);
  ::asio::ip::basic_resolver_results<asio::ip::tcp>::~basic_resolver_results
            ((basic_resolver_results<asio::ip::tcp> *)0x7d3e9a);
  ::asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(this_00);
  return;
}

Assistant:

void async_connect(
        std::string host,
        std::string service,
        std::function<void(const std::error_code&)> cb)
    {
        asio::ip::tcp::resolver::query query(
            asio::ip::tcp::v4(), host, service);
        auto endpoint_iterator = resolver_.resolve(query);

        socket_.lowest_layer().async_connect(*endpoint_iterator, cb);
    }